

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O1

Value * duckdb::HivePartitioning::GetValue
                  (Value *__return_storage_ptr__,ClientContext *context,string *key,string *str_val,
                  LogicalType *type)

{
  size_type sVar1;
  InvalidInputException *this;
  long lVar2;
  LogicalType *this_00;
  bool bVar3;
  bool bVar4;
  string local_120;
  LogicalType local_100;
  LogicalType local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"NULL","");
  sVar1 = str_val->_M_string_length;
  if (sVar1 == local_120._M_string_length) {
    bVar3 = sVar1 == 0;
    if (!bVar3) {
      lVar2 = 0;
      do {
        bVar3 = StringUtil::ASCII_TO_LOWER_MAP[(byte)(str_val->_M_dataplus)._M_p[lVar2]] ==
                StringUtil::ASCII_TO_LOWER_MAP[(byte)local_120._M_dataplus._M_p[lVar2]];
        if (!bVar3) break;
        bVar4 = sVar1 - 1 != lVar2;
        lVar2 = lVar2 + 1;
      } while (bVar4);
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (bVar3) {
    LogicalType::LogicalType(&local_e8,type);
    Value::Value(__return_storage_ptr__,&local_e8);
    this_00 = &local_e8;
  }
  else {
    if (type->id_ == VARCHAR) {
      StringUtil::URLDecode(&local_50,str_val,false);
      Value::Value(__return_storage_ptr__,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_50._M_dataplus._M_p);
      return __return_storage_ptr__;
    }
    if (str_val->_M_string_length != 0) {
      StringUtil::URLDecode(&local_70,str_val,false);
      Value::Value(__return_storage_ptr__,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      bVar3 = Value::TryCastAs(__return_storage_ptr__,context,type,false);
      if (bVar3) {
        return __return_storage_ptr__;
      }
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,
                 "Unable to cast \'%s\' (from hive partition column \'%s\') to: \'%s\'","");
      Value::ToString_abi_cxx11_(&local_90,__return_storage_ptr__);
      StringUtil::Upper(&local_b0,key);
      LogicalType::ToString_abi_cxx11_(&local_d0,type);
      InvalidInputException::
      InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this,&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                 &local_b0,&local_d0);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_100,type);
    Value::Value(__return_storage_ptr__,&local_100);
    this_00 = &local_100;
  }
  LogicalType::~LogicalType(this_00);
  return __return_storage_ptr__;
}

Assistant:

Value HivePartitioning::GetValue(ClientContext &context, const string &key, const string &str_val,
                                 const LogicalType &type) {
	// Handle nulls
	if (StringUtil::CIEquals(str_val, "NULL")) {
		return Value(type);
	}
	if (type.id() == LogicalTypeId::VARCHAR) {
		// for string values we can directly return the type
		return Value(Unescape(str_val));
	}
	if (str_val.empty()) {
		// empty strings are NULL for non-string types
		return Value(type);
	}

	// cast to the target type
	Value value(Unescape(str_val));
	if (!value.TryCastAs(context, type)) {
		throw InvalidInputException("Unable to cast '%s' (from hive partition column '%s') to: '%s'", value.ToString(),
		                            StringUtil::Upper(key), type.ToString());
	}
	return value;
}